

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O2

void nestl::test::detail::
     print_tuple<char_const(&)[11],char_const*&,char_const(&)[31],nestl::has_exceptions::exception_ptr_error_const&>
               (ostream *ostream,char (*args) [11],char **args_1,char (*args_2) [31],
               exception_ptr_error *args_3)

{
  tuple<const_char_*,_const_char_*,_const_char_*,_nestl::has_exceptions::exception_ptr_error>
  local_30;
  
  std::tuple<const_char_*,_const_char_*,_const_char_*,_nestl::has_exceptions::exception_ptr_error>::
  tuple<const_char_(&)[11],_const_char_*&,_const_char_(&)[31],_const_nestl::has_exceptions::exception_ptr_error_&,_true,_true>
            (&local_30,args,args_1,args_2,args_3);
  print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,char_const*,char_const*,nestl::has_exceptions::exception_ptr_error>,0ul,1ul,2ul,3ul>
            (ostream,&local_30);
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)&local_30);
  return;
}

Assistant:

void print_tuple(std::ostream& ostream, Args&&... args)
{
    print_tuple_impl(ostream, std::make_tuple(args...), gen_seq<sizeof...(Args)>());
}